

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataControllerDefault.cpp
# Opt level: O2

void __thiscall Rml::DataControllerValue::ProcessEvent(DataControllerValue *this,Event *event)

{
  bool bVar1;
  Element *this_00;
  Dictionary *this_01;
  const_iterator cVar2;
  const_iterator cVar3;
  DataModel *this_02;
  const_iterator cVar4;
  DataVariable variable;
  Variant value_to_set;
  
  this_00 = DataController::GetElement(&this->super_DataController);
  if (this_00 != (Element *)0x0) {
    Variant::Variant(&value_to_set);
    this_01 = Event::GetParameters_abi_cxx11_(event);
    cVar2 = itlib::
            flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
            ::find<char[28]>(this_01,(char (*) [28])"data-binding-override-value");
    cVar3 = itlib::
            flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
            ::find<char[6]>(this_01,(char (*) [6])0x31c259);
    cVar4 = cVar2;
    if ((cVar2._M_current ==
         (this_01->m_container).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (cVar4 = cVar3, cVar3._M_current == cVar2._M_current)) {
      Element::GetAddress_abi_cxx11_((String *)&variable,this_00,false,true);
      Log::Message(LT_WARNING,
                   "A \'change\' event was received, but it did not contain the attribute \'value\' when processing a data binding in %s"
                   ,variable.definition);
      ::std::__cxx11::string::~string((string *)&variable);
    }
    else {
      Variant::operator=(&value_to_set,&(cVar4._M_current)->second);
    }
    this_02 = Element::GetDataModel(this_00);
    if ((this_02 != (DataModel *)0x0) && (value_to_set.type != NONE)) {
      variable = DataModel::GetVariable(this_02,&this->address);
      if (variable.definition != (VariableDefinition *)0x0) {
        bVar1 = DataVariable::Set(&variable,&value_to_set);
        if (bVar1) {
          DataModel::DirtyVariable
                    (this_02,&((this->address).
                               super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start)->name);
        }
      }
    }
    Variant::~Variant(&value_to_set);
  }
  return;
}

Assistant:

void DataControllerValue::ProcessEvent(Event& event)
{
	if (const Element* element = GetElement())
	{
		Variant value_to_set;
		const auto& parameters = event.GetParameters();
		const auto override_value_it = parameters.find("data-binding-override-value");
		const auto value_it = parameters.find("value");
		if (override_value_it != parameters.cend())
			value_to_set = override_value_it->second;
		else if (value_it != parameters.cend())
			value_to_set = value_it->second;
		else
			Log::Message(Log::LT_WARNING,
				"A 'change' event was received, but it did not contain the attribute 'value' when processing a data binding in %s",
				element->GetAddress().c_str());

		DataModel* model = element->GetDataModel();
		if (value_to_set.GetType() == Variant::NONE || !model)
			return;

		if (DataVariable variable = model->GetVariable(address))
			if (variable.Set(value_to_set))
				model->DirtyVariable(address.front().name);
	}
}